

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::LogSumExp::forward_impl
          (LogSumExp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  pointer ppTVar1;
  pointer ppTVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  Tensor local_b0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppTVar1 - (long)ppTVar2;
  if ((uVar3 & 0x7fffffff8) == 8) {
    fx->v = (*ppTVar2)->v;
  }
  else {
    if (ppTVar1 == ppTVar2) {
      uVar3 = (long)uVar3 >> 3;
      local_b0.v = (float *)(this->super_Node).aux_mem;
    }
    else {
      uVar4 = 1;
      uVar5 = 0;
      do {
        Tensor::operator*((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                          &local_b0,ppTVar2[uVar5]);
        if ((CONCAT44(local_b0.d.d[3],local_b0.d.d[2]) < 1) ||
           (CONCAT44(local_b0.d.d[5],local_b0.d.d[4]) < 1)) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 0]"
                       );
        }
        local_b0.v = (float *)(this->super_Node).aux_mem;
        local_b0.v[uVar5] = *(float *)CONCAT44(local_b0.d.d[1],local_b0.d.d[0]);
        uVar5 = (ulong)uVar4;
        ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3;
        uVar4 = uVar4 + 1;
      } while (uVar5 < uVar3);
    }
    local_b0.d.d[0] = (uint)uVar3;
    local_b0.d.d[1] = (uint)local_68;
    local_b0.d.d[2] = (uint)((ulong)local_68 >> 0x20);
    local_b0.d.d[3] = (uint)uStack_60;
    local_b0.d.d[4] = (uint)((ulong)uStack_60 >> 0x20);
    local_b0.d.d[5] = (uint)local_58;
    local_b0.d.d[6] = (uint)((ulong)local_58 >> 0x20);
    local_b0.d.nd = 1;
    local_b0.d.bd = 1;
    local_b0.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Tensor::operator*(&local_50,&local_b0);
    fVar6 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                      (&local_50);
    *fx->v = fVar6;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_b0.bs);
  }
  return;
}

Assistant:

void LogSumExp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  const unsigned num_args = xs.size();
  if (num_args == 1) {
    fx.v = xs[0]->v;
    return;
  }
  for (unsigned i = 0; i < xs.size(); ++i)
    static_cast<float*>(aux_mem)[i] = (**xs[i])(0,0);
  Dim r = {(unsigned int)xs.size()};
  Tensor v(r, static_cast<float*>(aux_mem));
  fx.v[0] = logsumexp(*v);
}